

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitFunction(PrintSExpression *this,Function *curr)

{
  if ((curr->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
    visitImportedFunction(this,curr);
    return;
  }
  if (curr->body != (Expression *)0x0) {
    visitDefinedFunction(this,curr);
    return;
  }
  return;
}

Assistant:

void PrintSExpression::visitFunction(Function* curr) {
  if (curr->imported()) {
    visitImportedFunction(curr);
  } else if (curr->body == nullptr) {
    // We are in the middle of parsing the module and have not parsed this
    // function's code yet. Skip it.
  } else {
    visitDefinedFunction(curr);
  }
}